

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

int __thiscall
ON_BinaryArchive::Read3dmInstanceDefinition
          (ON_BinaryArchive *this,ON_InstanceDefinition **ppInstanceDefinition)

{
  bool bVar1;
  int iVar2;
  ON_InstanceDefinition *model_component;
  int iVar3;
  ON__UINT32 tcode;
  ON_Object *p;
  ON__INT64 big_value;
  
  bVar1 = Read3dmTableRecord(this,instance_definition_table,ppInstanceDefinition);
  if (!bVar1) {
    return 0;
  }
  tcode = 0;
  big_value = 0;
  bVar1 = BeginRead3dmBigChunk(this,&tcode,&big_value);
  iVar3 = 0;
  if (bVar1) {
    if (tcode == 0xffffffff) {
      model_component = (ON_InstanceDefinition *)0x0;
    }
    else {
      if (tcode == 0x20008076) {
        Internal_Increment3dmTableItemCount(this);
        p = (ON_Object *)0x0;
        iVar2 = ReadObject(this,&p);
        if (iVar2 != 0) {
          model_component = ON_InstanceDefinition::Cast(p);
          if (model_component != (ON_InstanceDefinition *)0x0) goto LAB_003d2406;
          if (p != (ON_Object *)0x0) {
            (*p->_vptr_ON_Object[4])();
          }
        }
        iVar2 = 0x2e32;
      }
      else {
        iVar2 = 0x2e36;
      }
      model_component = (ON_InstanceDefinition *)0x0;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,iVar2,"",
                 "ON_BinaryArchive::Read3dmInstanceDefinition() - corrupt instance definition table"
                );
    }
LAB_003d2406:
    EndRead3dmChunk(this);
    if (model_component != (ON_InstanceDefinition *)0x0) {
      Internal_Read3dmUpdateManifest(this,&model_component->super_ON_ModelComponent);
      iVar3 = 1;
      goto LAB_003d2427;
    }
  }
  model_component = (ON_InstanceDefinition *)0x0;
LAB_003d2427:
  *ppInstanceDefinition = model_component;
  return iVar3;
}

Assistant:

int ON_BinaryArchive::Read3dmInstanceDefinition( ON_InstanceDefinition** ppInstanceDefinition )
{
  if ( false == Read3dmTableRecord(ON_3dmArchiveTableType::instance_definition_table, (void**)ppInstanceDefinition))
    return 0;

  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  ON_InstanceDefinition* idef = nullptr;
  if ( BeginRead3dmBigChunk( &tcode, &big_value ) ) 
  {
    if ( tcode == TCODE_INSTANCE_DEFINITION_RECORD )
    {
      Internal_Increment3dmTableItemCount();
      ON_Object* p = 0;
      if ( ReadObject( &p ) ) {
        idef = ON_InstanceDefinition::Cast(p);
        if ( !idef )
          delete p;
      }
      if (!idef) {
        ON_ERROR("ON_BinaryArchive::Read3dmInstanceDefinition() - corrupt instance definition table");
      }
    }
    else if ( tcode != TCODE_ENDOFTABLE ) {
      ON_ERROR("ON_BinaryArchive::Read3dmInstanceDefinition() - corrupt instance definition table");
    }
    EndRead3dmChunk();
  }
  if (idef)
  {
    Internal_Read3dmUpdateManifest(*idef);
  }
  *ppInstanceDefinition = idef;
  return (idef) ? 1 : 0;
}